

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

void __thiscall Model::RegisterTranscript(Model *this,Ptr *transcript)

{
  element_type *peVar1;
  SpeciesTracker *inst;
  Ptr PStack_28;
  
  std::__shared_ptr<Polymer,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Transcript,void>
            ((__shared_ptr<Polymer,(__gnu_cxx::_Lock_policy)2> *)&PStack_28,
             &transcript->super___shared_ptr<Transcript,_(__gnu_cxx::_Lock_policy)2>);
  RegisterPolymer(this,&PStack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&PStack_28.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  peVar1 = (transcript->super___shared_ptr<Transcript,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  inst = SpeciesTracker::Instance();
  Signal<std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::ConnectMember<SpeciesTracker>(&(peVar1->super_Polymer).termination_signal_,inst,0x120be2);
  if (this->initialized_ == false) {
    std::vector<std::shared_ptr<Transcript>,_std::allocator<std::shared_ptr<Transcript>_>_>::
    push_back(&this->transcripts_,transcript);
  }
  return;
}

Assistant:

void Model::RegisterTranscript(Transcript::Ptr transcript) {
  RegisterPolymer(transcript);
  transcript->termination_signal_.ConnectMember(
      &SpeciesTracker::Instance(), &SpeciesTracker::TerminateTranslation);
  if (initialized_ == false) {
    transcripts_.push_back(transcript);
  }
}